

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

double anon_unknown.dwarf_9fd58::ParseDouble(ExpressionContext *ctx,char *str)

{
  char cVar1;
  int *piVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  dVar6 = 0.0;
  dVar8 = 0.0;
  cVar1 = (char)ctx->optimizationLevel;
  while ((int)cVar1 - 0x30U < 10) {
    dVar8 = dVar8 * 10.0 + (double)(int)((int)cVar1 - 0x30U);
    piVar2 = &ctx->optimizationLevel;
    ctx = (ExpressionContext *)((long)&ctx->optimizationLevel + 1);
    cVar1 = *(char *)((long)piVar2 + 1);
  }
  if (cVar1 == '.') {
    piVar2 = &ctx->optimizationLevel;
    ctx = (ExpressionContext *)((long)&ctx->optimizationLevel + 1);
    uVar3 = (int)*(char *)((long)piVar2 + 1) - 0x30;
    if (uVar3 < 10) {
      dVar6 = 0.0;
      dVar7 = 0.1;
      do {
        dVar6 = dVar6 + (double)(int)uVar3 * dVar7;
        dVar7 = dVar7 / 10.0;
        piVar2 = &ctx->optimizationLevel;
        ctx = (ExpressionContext *)((long)&ctx->optimizationLevel + 1);
        uVar3 = (int)*(char *)((long)piVar2 + 1) - 0x30;
      } while (uVar3 < 10);
    }
  }
  if ((char)ctx->optimizationLevel != 'e') {
    return dVar8 + dVar6;
  }
  iVar4 = (int)*(char *)((long)&ctx->optimizationLevel + 1);
  if (iVar4 == 0x2d) {
    uVar3 = (int)*(char *)((long)&ctx->optimizationLevel + 2) - 0x30;
    iVar4 = 0;
    if (uVar3 < 10) {
      pcVar5 = (char *)((long)&ctx->optimizationLevel + 3);
      iVar4 = 0;
      do {
        iVar4 = uVar3 + iVar4 * 10;
        uVar3 = (int)*pcVar5 - 0x30;
        pcVar5 = pcVar5 + 1;
      } while (uVar3 < 10);
    }
    iVar4 = -iVar4;
  }
  else {
    uVar3 = iVar4 - 0x30;
    dVar7 = 0.0;
    if (9 < uVar3) goto LAB_0015aff9;
    pcVar5 = (char *)((long)&ctx->optimizationLevel + 2);
    iVar4 = 0;
    do {
      iVar4 = uVar3 + iVar4 * 10;
      uVar3 = (int)*pcVar5 - 0x30;
      pcVar5 = pcVar5 + 1;
    } while (uVar3 < 10);
  }
  dVar7 = (double)iVar4;
LAB_0015aff9:
  dVar7 = pow(10.0,dVar7);
  return (dVar8 + dVar6) * dVar7;
}

Assistant:

double ParseDouble(ExpressionContext &ctx, const char *str)
	{
		unsigned digit;
		double integer = 0.0;

		while((digit = *str - '0') < 10)
		{
			integer = integer * 10.0 + digit;
			str++;
		}

		double fractional = 0.0;
	
		if(*str == '.')
		{
			double power = 0.1;
			str++;

			while((digit = *str - '0') < 10)
			{
				fractional = fractional + power * digit;
				power /= 10.0;
				str++;
			}
		}

		if(*str == 'e')
		{
			str++;

			if(*str == '-')
				return (integer + fractional) * pow(10.0, (double)-ParseInteger(ctx, str + 1));
			else
				return (integer + fractional) * pow(10.0, (double)ParseInteger(ctx, str));
		}

		return integer + fractional;
	}